

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmListFileContext *lfc,cmExecutionStatus *status)

{
  CallStackEntry entry;
  value_type local_10;
  
  this->Makefile = mf;
  local_10.Context = lfc;
  local_10.Status = status;
  std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::push_back
            (&mf->CallStack,&local_10);
  return;
}

Assistant:

cmMakefileCall::cmMakefileCall(cmMakefile* mf, const cmListFileContext& lfc,
                               cmExecutionStatus& status): Makefile(mf)
{
  cmMakefile::CallStackEntry entry = {&lfc, &status};
  this->Makefile->CallStack.push_back(entry);
}